

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O3

Range __thiscall Atari::ST::Video::get_memory_access_range(Video *this)

{
  Range RVar1;
  
  RVar1.high_address = this->previous_base_address_ + 0xdea2;
  RVar1.low_address = this->previous_base_address_;
  return RVar1;
}

Assistant:

Video::Range Video::get_memory_access_range() {
	Range range;
	range.low_address = uint32_t(previous_base_address_);
	range.high_address = range.low_address + 56994;
	// 56994 is pessimistic but unscientific, being derived from the resolution of the largest
	// fullscreen demo I could quickly find documentation of. TODO: calculate real number.
	return range;
}